

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Ant * __thiscall
Ant::updatePh(Ant *this,vector<Wall,_std::allocator<Wall>_> *walls,
             vector<Pheromone,_std::allocator<Pheromone>_> *pheromones,
             vector<Gate,_std::allocator<Gate>_> *gates)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  pointer pWVar4;
  pointer pGVar5;
  pointer pPVar6;
  int iVar7;
  Wall *wall;
  pointer pWVar8;
  int *piVar9;
  uint uVar10;
  pointer pGVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Pheromone *pher;
  pointer pPVar15;
  ulong uVar16;
  Pheromone PVar17;
  double dVar18;
  double dVar19;
  double local_38;
  
  iVar7 = this->x;
  uVar1 = this->y;
  uVar16 = (ulong)uVar1;
  pWVar8 = (walls->super__Vector_base<Wall,_std::allocator<Wall>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pWVar4 = (walls->super__Vector_base<Wall,_std::allocator<Wall>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pWVar8 == pWVar4) {
    iVar12 = -999999;
    iVar14 = 999999;
    uVar10 = 999999;
    uVar13 = 0xfff0bdc1;
  }
  else {
    uVar10 = 999999;
    uVar13 = 0xfff0bdc1;
    iVar12 = -999999;
    iVar14 = 999999;
    do {
      iVar2 = pWVar8->x;
      uVar3 = pWVar8->y;
      if (iVar2 == iVar7) {
        if ((int)uVar1 < (int)uVar3) {
          if ((int)uVar3 <= (int)uVar10) {
            uVar10 = uVar3;
          }
        }
        else if (((int)uVar3 < (int)uVar1) && ((int)uVar13 < (int)uVar3)) {
          uVar13 = uVar3;
        }
      }
      else if (uVar3 == uVar1) {
        if (iVar7 < iVar2) {
          if (iVar2 <= iVar14) {
            iVar14 = iVar2;
          }
        }
        else if ((iVar2 < iVar7) && (iVar12 < iVar2)) {
          iVar12 = iVar2;
        }
      }
      pWVar8 = pWVar8 + 1;
    } while (pWVar8 != pWVar4);
  }
  pGVar11 = (gates->super__Vector_base<Gate,_std::allocator<Gate>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  pGVar5 = (gates->super__Vector_base<Gate,_std::allocator<Gate>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pGVar11 != pGVar5) {
    piVar9 = &pGVar11->facing;
    do {
      iVar2 = ((Gate *)(piVar9 + -2))->x;
      uVar3 = piVar9[-1];
      if (iVar2 == iVar7) {
        if (*piVar9 == 1 && (int)uVar1 < (int)uVar3) {
          if ((int)uVar3 <= (int)uVar10) {
            uVar10 = uVar3;
          }
        }
        else if ((*piVar9 == 3 && (int)uVar3 < (int)uVar1) && ((int)uVar13 < (int)uVar3)) {
          uVar13 = uVar3;
        }
      }
      else if (uVar3 == uVar1) {
        if (*piVar9 == 0 && iVar7 < iVar2) {
          if (iVar2 <= iVar14) {
            iVar14 = iVar2;
          }
        }
        else if ((*piVar9 == 2 && iVar2 < iVar7) && (iVar12 < iVar2)) {
          iVar12 = iVar2;
        }
      }
      pGVar11 = (pointer)(piVar9 + 1);
      piVar9 = piVar9 + 3;
    } while (pGVar11 != pGVar5);
  }
  PVar17.x = iVar7 - 1;
  PVar17.y = 0;
  pPVar15 = (pheromones->super__Vector_base<Pheromone,_std::allocator<Pheromone>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar6 = (pheromones->super__Vector_base<Pheromone,_std::allocator<Pheromone>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar15 != pPVar6) {
    local_38 = 999999.0;
    do {
      dVar19 = (double)(pPVar15->x - this->x);
      dVar18 = (double)(pPVar15->y - this->y);
      dVar18 = dVar18 * dVar18 + dVar19 * dVar19;
      if (dVar18 < 0.0) {
        dVar18 = sqrt(dVar18);
      }
      else {
        dVar18 = SQRT(dVar18);
      }
      if (((((0.0 < dVar18) && (dVar18 < local_38)) && ((int)uVar13 < pPVar15->y)) &&
          ((pPVar15->y < (int)uVar10 && (iVar12 < pPVar15->x)))) && (pPVar15->x < iVar14)) {
        PVar17 = *pPVar15;
        uVar16 = (ulong)PVar17 >> 0x20;
        local_38 = dVar18;
      }
      pPVar15 = pPVar15 + 1;
    } while (pPVar15 != pPVar6);
  }
  this->t = (Pheromone)((ulong)PVar17 & 0xffffffff | uVar16 << 0x20);
  iVar7 = 0;
  if (this->x <= PVar17.x) {
    iVar7 = 1;
    if (((this->y <= (int)uVar16) && (iVar7 = 2, PVar17.x <= this->x)) &&
       (iVar7 = 3, (int)uVar16 <= this->y)) {
      return this;
    }
  }
  this->direction = iVar7;
  return this;
}

Assistant:

Ant& updatePh(const vector<Wall> & walls, const vector<Pheromone> & pheromones, const vector<Gate> & gates) {
            int upperBound = -999999; int lowerBound = 999999;
            int leftBound = -999999; int rightBound = 999999;

            Pheromone target(x - 1, y);
            double bestDist = 999999;

            for (const Wall & wall : walls) {
                if (wall.x == x) {
                    if (wall.y > y)
                        lowerBound = min(wall.y, lowerBound);
                    else if (wall.y < y)
                        upperBound = max(wall.y, upperBound);
                } else if (wall.y == y) {
                    if (wall.x > x)
                        rightBound = min(wall.x, rightBound);
                    else if (wall.x < x)
                        leftBound = max(wall.x, leftBound);
                }
            }

            for (const Gate & gate : gates) {
                if (gate.x == x) {
                    if (gate.y > y && gate.facing == 1)
                        lowerBound = min(gate.y, lowerBound);
                    else if (gate.y < y && gate.facing == 3)
                        upperBound = max(gate.y, upperBound);
                } else if (gate.y == y) {
                    if (gate.x > x && gate.facing == 0)
                        rightBound = min(gate.x, rightBound);
                    else if (gate.x < x && gate.facing == 2)
                        leftBound = max(gate.x, leftBound);
                }
            }

            for (const Pheromone & pher : pheromones) {
                double d = dist({ pher.x, pher.y }, { x, y });
                if (0 < d && d < bestDist &&
                        upperBound < pher.y && pher.y < lowerBound &&
                        leftBound < pher.x && pher.x < rightBound) {
                    bestDist = d;
                    target = pher;
                }
            }

            this -> t = target;

            if (target.x < x)
                setFacing(0);
            else if (target.y < y)
                setFacing(1);
            else if (x < target.x)
                setFacing(2);
            else if (y < target.y)
                setFacing(3);

            return *this;
        }